

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidRankInconsistency(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  TypeUnion TVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  ActivationParams *pAVar12;
  ActivationReLU *pAVar13;
  NeuralNetworkLayer *pNVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  Tensor *pTVar16;
  void *pvVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  Arena *pAVar21;
  Model m;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001afb5d:
    pRVar20 = &(MStack_78.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar1 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001afb5d;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x10),"A",puVar19);
  if (*(long *)((long)pvVar17 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar17 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar17 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (*(long *)((long)pvVar17 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar17 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar17 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001afcc9:
    pRVar20 = &(MStack_78.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar1 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001afcc9;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar17 + 0x10),"C",puVar19);
  if (*(long *)((long)pvVar17 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar17 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar17 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar17 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar17 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  TVar6 = MStack_78.Type_;
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001afdcb:
    pNVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar14 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar14);
  }
  else {
    iVar1 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001afdcb;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar14 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  if (pNVar14->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
    pNVar14->_oneof_case_[0] = 0x82;
    uVar5 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                        (pAVar21);
    (pNVar14->layer_).activation_ = pAVar12;
  }
  pAVar12 = (pNVar14->layer_).activation_;
  if (pAVar12->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar12);
    pAVar12->_oneof_case_[0] = 10;
    uVar5 = (pAVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar21);
    (pAVar12->NonlinearityType_).relu_ = pAVar13;
  }
  uVar5 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar14->name_,"relu1",puVar19);
  pRVar4 = (pNVar14->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001afe9c:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->input_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001afe9c;
    (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar17,0,*(char **)((long)pvVar17 + 8),0x3b8534);
  pRVar4 = (pNVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001afeed:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->output_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001afeed;
    (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar17,0,*(char **)((long)pvVar17 + 8),0x3d8b56);
  pRVar4 = (pNVar14->outputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aff3e:
    pTVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((pNVar14->outputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->outputtensor_).super_RepeatedPtrFieldBase,pTVar16);
  }
  else {
    iVar1 = (pNVar14->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aff3e;
    (pNVar14->outputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  *(undefined4 *)((long)pvVar17 + 0x24) = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar6.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aff7e:
    pNVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar14 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar14);
  }
  else {
    iVar1 = (TVar6.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aff7e;
    (TVar6.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar14 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  if (pNVar14->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
    pNVar14->_oneof_case_[0] = 0x82;
    uVar5 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                        (pAVar21);
    (pNVar14->layer_).activation_ = pAVar12;
  }
  pAVar12 = (pNVar14->layer_).activation_;
  if (pAVar12->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar12);
    pAVar12->_oneof_case_[0] = 10;
    uVar5 = (pAVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar21);
    (pAVar12->NonlinearityType_).relu_ = pAVar13;
  }
  uVar5 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
  puVar19 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar14->name_,"relu2",puVar19);
  pRVar4 = (pNVar14->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b004c:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->input_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b004c;
    (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar17,0,*(char **)((long)pvVar17 + 8),0x3d8b56);
  pRVar4 = (pNVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b009c:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->output_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001b009c;
    (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar17 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar17,0,*(char **)((long)pvVar17 + 8),0x3b9e26);
  pRVar4 = (pNVar14->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar14->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar14->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar17 = pRVar4->elements[iVar1];
      goto LAB_001b0103;
    }
  }
  pTVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                      ((pNVar14->inputtensor_).super_RepeatedPtrFieldBase.arena_);
  pvVar17 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar14->inputtensor_).super_RepeatedPtrFieldBase,pTVar16);
LAB_001b0103:
  *(undefined4 *)((long)pvVar17 + 0x24) = 2;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar7 = CoreML::Result::good(&local_48);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12ce);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar7;
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */

    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);

    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);


    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}